

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasta_parser_test.cpp
# Opt level: O2

void __thiscall
bioparser::test::BioparserFastaTest_ParseWholeWithoutTrimming_Test::
~BioparserFastaTest_ParseWholeWithoutTrimming_Test
          (BioparserFastaTest_ParseWholeWithoutTrimming_Test *this)

{
  BioparserFastaTest::~BioparserFastaTest(&this->super_BioparserFastaTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(BioparserFastaTest, ParseWholeWithoutTrimming) {
  Setup("sample.fasta");
  s = p->Parse(-1, false);
  Check(false);
}